

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilterBase_init_Test::TestBody(UnscentedKalmanFilterBase_init_Test *this)

{
  T *this_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_e0 [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_e0);
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_e0._0_4_ = 0.0;
  local_e0._4_4_ = 0.0;
  this_00 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda;
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)this_00,"0","ukf.x[0]",0.0,0.0);
  if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)this_00,"0","ukf.x[1]",0.0,(float)local_e0._4_4_);
    if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x1c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_18.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)this_00,"0","ukf.x[2]",0.0,
                 ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                 super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
      if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_18);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x1d,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_18.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_18.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, init) {
    auto ukf = ConcreteUKF<Vector<T, 3>>(1,2,1);
    
    // x should be zero
    ASSERT_FLOAT_EQ(0, ukf.x[0]);
    ASSERT_FLOAT_EQ(0, ukf.x[1]);
    ASSERT_FLOAT_EQ(0, ukf.x[2]);
}